

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckd_alloc.c
# Opt level: O1

void ckd_free_4d(void *inptr)

{
  void ****ptr;
  
  if (inptr != (void *)0x0) {
    free(*(void **)**inptr);
    free((void *)**inptr);
    free(*inptr);
    free(inptr);
    return;
  }
  return;
}

Assistant:

void
ckd_free_4d(void *inptr)
{
    void ****ptr = (void ****)inptr;
    if (ptr == NULL)
	return;
    /* free the underlying store */
    ckd_free(ptr[0][0][0]);

    /* free the access overhead */
    ckd_free(ptr[0][0]);
    ckd_free(ptr[0]);
    ckd_free(ptr);
}